

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx::OrientedDiscMiIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  Scene *pSVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  uint uVar17;
  uint uVar18;
  undefined4 uVar19;
  ulong uVar20;
  RTCIntersectArguments *pRVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vbool<4> valid;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  int local_15c;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  float local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  RTCFilterFunctionNArguments local_f8;
  undefined1 local_c8 [32];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar36 [64];
  
  pSVar9 = context->scene;
  uVar20 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar10 = (pSVar9->geometries).items[Disc->sharedGeomID].ptr;
  lVar22 = *(long *)&pGVar10->field_0x58;
  _Var11 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar28 = *(undefined1 (*) [16])(lVar22 + _Var11 * uVar20);
  uVar23 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar29 = *(undefined1 (*) [16])(lVar22 + _Var11 * uVar23);
  uVar24 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar30 = *(undefined1 (*) [16])(lVar22 + _Var11 * uVar24);
  uVar25 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar39 = *(undefined1 (*) [16])(lVar22 + _Var11 * uVar25);
  auVar40 = vunpcklps_avx(auVar28,auVar30);
  local_138 = vunpckhps_avx(auVar28,auVar30);
  auVar28 = vunpcklps_avx(auVar29,auVar39);
  auVar31 = vunpckhps_avx(auVar29,auVar39);
  auVar32 = vunpcklps_avx(auVar40,auVar28);
  local_148 = vunpckhps_avx(auVar40,auVar28);
  lVar22 = *(long *)&pGVar10[1].time_range.upper;
  p_Var12 = pGVar10[1].intersectionFilterN;
  auVar28 = *(undefined1 (*) [16])(lVar22 + uVar20 * (long)p_Var12);
  auVar29 = *(undefined1 (*) [16])(lVar22 + uVar23 * (long)p_Var12);
  auVar30 = *(undefined1 (*) [16])(lVar22 + uVar24 * (long)p_Var12);
  auVar39 = *(undefined1 (*) [16])(lVar22 + (long)p_Var12 * uVar25);
  auVar40 = vunpcklps_avx(auVar28,auVar30);
  auVar28 = vunpckhps_avx(auVar28,auVar30);
  auVar30 = vunpcklps_avx(auVar29,auVar39);
  auVar29 = vunpckhps_avx(auVar29,auVar39);
  local_58 = vunpcklps_avx(auVar28,auVar29);
  local_98 = vunpcklps_avx(auVar40,auVar30);
  local_68 = vunpckhps_avx(auVar40,auVar30);
  local_48 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar1 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar39._0_4_ = local_98._0_4_ * fVar1 + fVar2 * local_68._0_4_ + fVar3 * local_58._0_4_;
  auVar39._4_4_ = local_98._4_4_ * fVar1 + fVar2 * local_68._4_4_ + fVar3 * local_58._4_4_;
  auVar39._8_4_ = local_98._8_4_ * fVar1 + fVar2 * local_68._8_4_ + fVar3 * local_58._8_4_;
  auVar39._12_4_ = local_98._12_4_ * fVar1 + fVar2 * local_68._12_4_ + fVar3 * local_58._12_4_;
  auVar29 = vcmpps_avx(auVar39,ZEXT416(0) << 0x20,4);
  auVar40._8_4_ = 0x3f800000;
  auVar40._0_8_ = 0x3f8000003f800000;
  auVar40._12_4_ = 0x3f800000;
  auVar28 = vblendvps_avx(auVar40,auVar39,auVar29);
  auVar16 = vunpcklps_avx(local_138,auVar31);
  fVar4 = (ray->super_RayK<1>).org.field_0.m128[1];
  auVar41._4_4_ = fVar4;
  auVar41._0_4_ = fVar4;
  auVar41._8_4_ = fVar4;
  auVar41._12_4_ = fVar4;
  fVar5 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar42._4_4_ = fVar5;
  auVar42._0_4_ = fVar5;
  auVar42._8_4_ = fVar5;
  auVar42._12_4_ = fVar5;
  auVar30 = vsubps_avx(auVar16,auVar42);
  auVar42 = local_58;
  auVar39 = vsubps_avx(local_148,auVar41);
  auVar41 = local_68;
  fVar6 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar43._4_4_ = fVar6;
  auVar43._0_4_ = fVar6;
  auVar43._8_4_ = fVar6;
  auVar43._12_4_ = fVar6;
  auVar40 = vsubps_avx(auVar32,auVar43);
  auVar27._0_4_ =
       local_98._0_4_ * auVar40._0_4_ +
       auVar30._0_4_ * local_58._0_4_ + local_68._0_4_ * auVar39._0_4_;
  auVar27._4_4_ =
       local_98._4_4_ * auVar40._4_4_ +
       auVar30._4_4_ * local_58._4_4_ + local_68._4_4_ * auVar39._4_4_;
  auVar27._8_4_ =
       local_98._8_4_ * auVar40._8_4_ +
       auVar30._8_4_ * local_58._8_4_ + local_68._8_4_ * auVar39._8_4_;
  auVar27._12_4_ =
       local_98._12_4_ * auVar40._12_4_ +
       auVar30._12_4_ * local_58._12_4_ + local_68._12_4_ * auVar39._12_4_;
  local_a8 = vdivps_avx(auVar27,auVar28);
  auVar33 = ZEXT1664(local_a8);
  uVar19 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar28._4_4_ = uVar19;
  auVar28._0_4_ = uVar19;
  auVar28._8_4_ = uVar19;
  auVar28._12_4_ = uVar19;
  auVar28 = vcmpps_avx(auVar28,local_a8,2);
  fVar7 = (ray->super_RayK<1>).tfar;
  auVar30._4_4_ = fVar7;
  auVar30._0_4_ = fVar7;
  auVar30._8_4_ = fVar7;
  auVar30._12_4_ = fVar7;
  auVar30 = vcmpps_avx(local_a8,auVar30,2);
  auVar28 = vandps_avx(auVar30,auVar28);
  auVar30 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar30 = vpcmpgtd_avx(auVar30,_DAT_01f7fcf0);
  auVar28 = vandps_avx(auVar28,auVar30);
  auVar30 = auVar29 & auVar28;
  if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar30[0xf] < '\0') {
    auVar28 = vandps_avx(auVar28,auVar29);
    auVar40 = vunpckhps_avx(local_138,auVar31);
    fVar7 = local_a8._0_4_;
    fVar13 = local_a8._4_4_;
    fVar14 = local_a8._8_4_;
    fVar15 = local_a8._12_4_;
    auVar31._0_4_ = fVar6 + fVar1 * fVar7;
    auVar31._4_4_ = fVar6 + fVar1 * fVar13;
    auVar31._8_4_ = fVar6 + fVar1 * fVar14;
    auVar31._12_4_ = fVar6 + fVar1 * fVar15;
    auVar34._0_4_ = fVar4 + fVar2 * fVar7;
    auVar34._4_4_ = fVar4 + fVar2 * fVar13;
    auVar34._8_4_ = fVar4 + fVar2 * fVar14;
    auVar34._12_4_ = fVar4 + fVar2 * fVar15;
    auVar37._0_4_ = fVar5 + fVar3 * fVar7;
    auVar37._4_4_ = fVar5 + fVar3 * fVar13;
    auVar37._8_4_ = fVar5 + fVar3 * fVar14;
    auVar37._12_4_ = fVar5 + fVar3 * fVar15;
    auVar29 = vsubps_avx(auVar31,auVar32);
    auVar30 = vsubps_avx(auVar34,local_148);
    auVar39 = vsubps_avx(auVar37,auVar16);
    auVar32._0_4_ =
         auVar29._0_4_ * auVar29._0_4_ +
         auVar30._0_4_ * auVar30._0_4_ + auVar39._0_4_ * auVar39._0_4_;
    auVar32._4_4_ =
         auVar29._4_4_ * auVar29._4_4_ +
         auVar30._4_4_ * auVar30._4_4_ + auVar39._4_4_ * auVar39._4_4_;
    auVar32._8_4_ =
         auVar29._8_4_ * auVar29._8_4_ +
         auVar30._8_4_ * auVar30._8_4_ + auVar39._8_4_ * auVar39._8_4_;
    auVar32._12_4_ =
         auVar29._12_4_ * auVar29._12_4_ +
         auVar30._12_4_ * auVar30._12_4_ + auVar39._12_4_ * auVar39._12_4_;
    auVar29._0_4_ = auVar40._0_4_ * auVar40._0_4_;
    auVar29._4_4_ = auVar40._4_4_ * auVar40._4_4_;
    auVar29._8_4_ = auVar40._8_4_ * auVar40._8_4_;
    auVar29._12_4_ = auVar40._12_4_ * auVar40._12_4_;
    auVar29 = vcmpps_avx(auVar32,auVar29,1);
    auVar30 = auVar28 & auVar29;
    if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar30[0xf] < '\0')
    {
      auVar16._0_4_ = (ray->super_RayK<1>).tfar;
      auVar16._4_4_ = (ray->super_RayK<1>).mask;
      auVar16._8_4_ = (ray->super_RayK<1>).id;
      auVar16._12_4_ = (ray->super_RayK<1>).flags;
      auVar38 = ZEXT1664(auVar16);
      auVar28 = vandps_avx(auVar28,auVar29);
      local_c8 = ZEXT432(0) << 0x20;
      local_88 = local_68._0_8_;
      uStack_80 = local_68._8_8_;
      local_78 = local_58._0_8_;
      uStack_70 = local_58._8_8_;
      local_158 = auVar28;
      auVar35._8_4_ = 0x7f800000;
      auVar35._0_8_ = 0x7f8000007f800000;
      auVar35._12_4_ = 0x7f800000;
      auVar36 = ZEXT1664(auVar35);
      auVar29 = vblendvps_avx(auVar35,local_a8,auVar28);
      auVar30 = vshufps_avx(auVar29,auVar29,0xb1);
      auVar30 = vminps_avx(auVar30,auVar29);
      auVar39 = vshufpd_avx(auVar30,auVar30,1);
      auVar30 = vminps_avx(auVar39,auVar30);
      auVar29 = vcmpps_avx(auVar29,auVar30,0);
      auVar30 = auVar28 & auVar29;
      if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar30[0xf] < '\0'
         ) {
        auVar28 = vandps_avx(auVar29,auVar28);
      }
      uVar17 = vextractps_avx(auVar16,1);
      uVar18 = vmovmskps_avx(auVar28);
      lVar22 = 0;
      local_68 = auVar41;
      local_58 = auVar42;
      if (uVar18 != 0) {
        for (; (uVar18 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
        }
      }
      do {
        local_110 = *(uint *)(local_48 + lVar22 * 4);
        pRVar21 = (RTCIntersectArguments *)(ulong)local_110;
        pGVar10 = (pSVar9->geometries).items[(long)pRVar21].ptr;
        if ((pGVar10->mask & uVar17) == 0) {
          *(undefined4 *)(local_158 + lVar22 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar1 = *(float *)(local_c8 + lVar22 * 4);
            fVar2 = *(float *)(local_c8 + lVar22 * 4 + 0x10);
            (ray->super_RayK<1>).tfar = *(float *)(local_a8 + lVar22 * 4);
            (ray->Ng).field_0.field_0.x = *(float *)(local_98 + lVar22 * 4);
            (ray->Ng).field_0.field_0.y = *(float *)((long)&local_88 + lVar22 * 4);
            (ray->Ng).field_0.field_0.z = *(float *)((long)&local_78 + lVar22 * 4);
            ray->u = fVar1;
            ray->v = fVar2;
            ray->primID = (Disc->primIDs).field_0.i[lVar22];
            ray->geomID = local_110;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            return;
          }
          local_138 = auVar38._0_16_;
          local_148 = auVar33._0_16_;
          local_128 = *(float *)(local_98 + lVar22 * 4);
          local_124 = *(undefined4 *)((long)&local_88 + lVar22 * 4);
          local_120 = *(undefined4 *)((long)&local_78 + lVar22 * 4);
          local_11c = *(undefined4 *)(local_c8 + lVar22 * 4);
          local_118 = *(undefined4 *)(local_c8 + lVar22 * 4 + 0x10);
          local_114 = (Disc->primIDs).field_0.i[lVar22];
          pRVar21 = (RTCIntersectArguments *)0x0;
          local_10c = context->user->instID[0];
          local_108 = context->user->instPrimID[0];
          (ray->super_RayK<1>).tfar = *(float *)(local_a8 + lVar22 * 4);
          local_15c = -1;
          local_f8.valid = &local_15c;
          local_f8.geometryUserPtr = pGVar10->userPtr;
          local_f8.context = context->user;
          local_f8.ray = (RTCRayN *)ray;
          local_f8.hit = (RTCHitN *)&local_128;
          local_f8.N = 1;
          if ((pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar10->intersectionFilterN)(&local_f8), *local_f8.valid != 0)) {
            pRVar21 = context->args;
            if ((pRVar21->filter != (RTCFilterFunctionN)0x0) &&
               ((((pRVar21->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                  RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)) &&
                ((*pRVar21->filter)(&local_f8), *local_f8.valid == 0)))) goto LAB_00dcfc3a;
            (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.x = *(float *)local_f8.hit;
            (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.y =
                 *(float *)(local_f8.hit + 4);
            (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.z =
                 *(float *)(local_f8.hit + 8);
            *(float *)((long)local_f8.ray + 0x3c) = *(float *)(local_f8.hit + 0xc);
            *(float *)((long)local_f8.ray + 0x40) = *(float *)(local_f8.hit + 0x10);
            *(float *)((long)local_f8.ray + 0x44) = *(float *)(local_f8.hit + 0x14);
            *(float *)((long)local_f8.ray + 0x48) = *(float *)(local_f8.hit + 0x18);
            *(float *)((long)local_f8.ray + 0x4c) = *(float *)(local_f8.hit + 0x1c);
            pRVar21 = (RTCIntersectArguments *)0x0;
            *(float *)((long)local_f8.ray + 0x50) = *(float *)(local_f8.hit + 0x20);
          }
          else {
LAB_00dcfc3a:
            (ray->super_RayK<1>).tfar = (float)local_138._0_4_;
          }
          auVar33 = ZEXT1664(local_148);
          auVar36 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          *(undefined4 *)(local_158 + lVar22 * 4) = 0;
          fVar1 = (ray->super_RayK<1>).tfar;
          auVar26._4_4_ = fVar1;
          auVar26._0_4_ = fVar1;
          auVar26._8_4_ = fVar1;
          auVar26._12_4_ = fVar1;
          auVar28 = vcmpps_avx(local_148,auVar26,2);
          local_158 = vandps_avx(auVar28,local_158);
          auVar8._0_4_ = (ray->super_RayK<1>).tfar;
          auVar8._4_4_ = (ray->super_RayK<1>).mask;
          auVar8._8_4_ = (ray->super_RayK<1>).id;
          auVar8._12_4_ = (ray->super_RayK<1>).flags;
          auVar38 = ZEXT1664(auVar8);
          uVar17 = vextractps_avx(auVar8,1);
        }
        if ((((local_158 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_158 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_158 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_158[0xf]) {
          return;
        }
        auVar28 = vblendvps_avx(auVar36._0_16_,auVar33._0_16_,local_158);
        auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
        auVar29 = vminps_avx(auVar29,auVar28);
        auVar30 = vshufpd_avx(auVar29,auVar29,1);
        auVar29 = vminps_avx(auVar30,auVar29);
        auVar29 = vcmpps_avx(auVar28,auVar29,0);
        auVar30 = local_158 & auVar29;
        auVar28 = local_158;
        if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar30[0xf] < '\0') {
          auVar28 = vandps_avx(auVar29,local_158);
        }
        uVar19 = vmovmskps_avx(auVar28);
        uVar20 = CONCAT44((int)((ulong)pRVar21 >> 0x20),uVar19);
        lVar22 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, n0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }